

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

void __thiscall
ON_3dmAnnotationSettings::SetWorldViewHatchScale
          (ON_3dmAnnotationSettings *this,double world_view_hatch_scale)

{
  bool bVar1;
  ON_3dmAnnotationSettingsPrivate *this_00;
  double dVar2;
  double world_view_hatch_scale_local;
  ON_3dmAnnotationSettings *this_local;
  
  if (((this != &Default) && (bVar1 = ON_IsValid(world_view_hatch_scale), bVar1)) &&
     (0.0 < world_view_hatch_scale)) {
    dVar2 = WorldViewHatchScale(this);
    if ((dVar2 != world_view_hatch_scale) || (NAN(dVar2) || NAN(world_view_hatch_scale))) {
      if (this->m_private == (ON_3dmAnnotationSettingsPrivate *)0x0) {
        this_00 = (ON_3dmAnnotationSettingsPrivate *)operator_new(0x1c);
        memset(this_00,0,0x1c);
        ON_3dmAnnotationSettingsPrivate::ON_3dmAnnotationSettingsPrivate(this_00);
        this->m_private = this_00;
      }
      this->m_private->m_world_view_hatch_scale = (float)world_view_hatch_scale;
    }
  }
  return;
}

Assistant:

void ON_3dmAnnotationSettings::SetWorldViewHatchScale(double world_view_hatch_scale)
{
  if (this == &ON_3dmAnnotationSettings::Default)
    return;
  if (ON_IsValid(world_view_hatch_scale) && world_view_hatch_scale > 0.0)
  {
    if (WorldViewHatchScale() != world_view_hatch_scale)
    {
      if (nullptr == m_private)
        m_private = new ON_3dmAnnotationSettingsPrivate();
      m_private->m_world_view_hatch_scale = (float)world_view_hatch_scale;
    }
  }
}